

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O0

int IsSmooth(uint32_t *prev_row,uint32_t *curr_row,uint32_t *next_row,int ix,int limit)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 local_21;
  
  iVar1 = IsNear(*(uint32_t *)(in_RSI + (long)in_ECX * 4),
                 *(uint32_t *)(in_RSI + (long)(in_ECX + -1) * 4),in_R8D);
  local_21 = false;
  if (iVar1 != 0) {
    iVar1 = IsNear(*(uint32_t *)(in_RSI + (long)in_ECX * 4),
                   *(uint32_t *)(in_RSI + (long)(in_ECX + 1) * 4),in_R8D);
    local_21 = false;
    if (iVar1 != 0) {
      iVar1 = IsNear(*(uint32_t *)(in_RSI + (long)in_ECX * 4),
                     *(uint32_t *)(in_RDI + (long)in_ECX * 4),in_R8D);
      local_21 = false;
      if (iVar1 != 0) {
        iVar1 = IsNear(*(uint32_t *)(in_RSI + (long)in_ECX * 4),
                       *(uint32_t *)(in_RDX + (long)in_ECX * 4),in_R8D);
        local_21 = iVar1 != 0;
      }
    }
  }
  return (int)local_21;
}

Assistant:

static int IsSmooth(const uint32_t* const prev_row,
                    const uint32_t* const curr_row,
                    const uint32_t* const next_row,
                    int ix, int limit) {
  // Check that all pixels in 4-connected neighborhood are smooth.
  return (IsNear(curr_row[ix], curr_row[ix - 1], limit) &&
          IsNear(curr_row[ix], curr_row[ix + 1], limit) &&
          IsNear(curr_row[ix], prev_row[ix], limit) &&
          IsNear(curr_row[ix], next_row[ix], limit));
}